

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O3

string * booster::locale::time_zone::global(string *__return_storage_ptr__,string *new_id)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &tz_mutex::m;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  tz_id_abi_cxx11_();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,tz_id[abi:cxx11]()::id_abi_cxx11_._M_dataplus._M_p,
             tz_id[abi:cxx11]()::id_abi_cxx11_._M_dataplus._M_p +
             tz_id[abi:cxx11]()::id_abi_cxx11_._M_string_length);
  tz_id_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&tz_id[abi:cxx11]()::id_abi_cxx11_);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string global(std::string const &new_id)
    {
        booster::unique_lock<booster::mutex> lock(tz_mutex());
        std::string id = tz_id();
        tz_id() = new_id;
        return id;
    }